

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampRangeClampCase::init
          (TextureBorderClampRangeClampCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint s;
  Texture2D *this_00;
  Texture2D *this_01;
  TextureFormat *baseFormat;
  int *piVar2;
  size_type sVar3;
  reference pvVar4;
  bool isSigned_00;
  float fVar5;
  int local_7b0;
  int local_7a8;
  int local_7a0;
  int local_798;
  bool local_791;
  bool local_781;
  IterationConfig *iteration_8;
  int ndx_1;
  anon_union_16_3_1194ccdc_for_v local_760;
  Vector<float,_2> local_750;
  Vector<float,_2> local_748;
  undefined1 local_740 [8];
  IterationConfig iteration_7;
  anon_union_16_3_1194ccdc_for_v local_6b8;
  Vector<float,_2> local_6a8;
  Vector<float,_2> local_6a0;
  undefined1 local_698 [8];
  IterationConfig iteration_6;
  Vec4 lookupScale;
  Vec4 lookupBias;
  float fStack_5f4;
  bool isSigned_1;
  Vector<float,_4> local_5e8;
  Vector<float,_4> local_5d8;
  undefined8 local_5c8;
  float afStack_5c0 [2];
  GenericVec4 local_5b8;
  Vector<float,_2> local_5a8;
  Vector<float,_2> local_5a0;
  undefined1 local_598 [8];
  IterationConfig iteration_5;
  IVec4 value_3;
  Vector<float,_4> local_500;
  Vector<float,_4> local_4f0;
  undefined8 local_4e0;
  float afStack_4d8 [2];
  Vector<unsigned_int,_4> local_4d0;
  GenericVec4 local_4c0;
  Vector<float,_2> local_4b0;
  Vector<float,_2> local_4a8;
  undefined1 local_4a0 [8];
  IterationConfig iteration_4;
  IVec4 value_2;
  Vector<float,_4> local_408;
  Vector<float,_4> local_3f8;
  undefined8 local_3e8;
  float afStack_3e0 [2];
  GenericVec4 local_3d8;
  Vector<float,_2> local_3c8;
  Vector<float,_2> local_3c0;
  undefined1 local_3b8 [8];
  IterationConfig iteration_3;
  undefined1 local_330 [8];
  IVec4 value_1;
  Vector<float,_4> local_310;
  Vector<float,_4> local_300;
  undefined8 local_2f0;
  float local_2e8 [2];
  Vector<unsigned_int,_4> local_2e0;
  GenericVec4 local_2d0;
  Vector<float,_2> local_2c0;
  Vector<float,_2> local_2b8;
  undefined1 local_2b0 [8];
  IterationConfig iteration_2;
  undefined1 local_228 [8];
  IVec4 value;
  IVec4 divSafeRange;
  IVec4 valueRange;
  IVec4 maxValue;
  IVec4 minValue;
  int ndx;
  bool isSigned;
  IVec4 numBits;
  Vector<float,_4> local_1b0;
  Vector<float,_4> local_1a0;
  GenericVec4 local_190;
  Vector<float,_2> local_180;
  Vector<float,_2> local_178;
  undefined1 local_170 [8];
  IterationConfig iteration_1;
  float fStack_f0;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  GenericVec4 local_c4;
  Vector<float,_2> local_b4 [2];
  Vector<float,_2> local_a0;
  undefined1 local_98 [8];
  IterationConfig iteration;
  bool isPureInteger;
  bool isFixed;
  bool isFloat;
  TextureFormat TStack_18;
  bool isDepth;
  TextureFormat texFormat;
  TextureBorderClampRangeClampCase *this_local;
  
  texFormat = (TextureFormat)this;
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  this_00 = TextureBorderClampTest::getTexture(&this->super_TextureBorderClampTest);
  this_01 = glu::Texture2D::getRefTexture(this_00);
  baseFormat = tcu::TextureLevelPyramid::getFormat(&this_01->super_TextureLevelPyramid);
  TStack_18 = tcu::getEffectiveDepthStencilTextureFormat
                        (baseFormat,(this->super_TextureBorderClampTest).m_sampleMode);
  iteration.compareRef._3_1_ =
       isDepthFormat((this->super_TextureBorderClampTest).m_texFormat,
                     (this->super_TextureBorderClampTest).m_sampleMode);
  iteration.compareRef._2_1_ =
       (this->super_TextureBorderClampTest).m_channelClass == TEXTURECHANNELCLASS_FLOATING_POINT;
  local_781 = true;
  if ((this->super_TextureBorderClampTest).m_channelClass != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
  {
    local_781 = (this->super_TextureBorderClampTest).m_channelClass ==
                TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
  }
  iteration.compareRef._1_1_ = local_781;
  local_791 = true;
  if ((this->super_TextureBorderClampTest).m_channelClass != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_791 = (this->super_TextureBorderClampTest).m_channelClass ==
                TEXTURECHANNELCLASS_UNSIGNED_INTEGER;
  }
  iteration.compareRef._0_1_ = local_791;
  if (((bool)iteration.compareRef._3_1_) || ((bool)iteration.compareRef._2_1_)) {
    TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_98);
    tcu::Vector<float,_2>::Vector(&local_a0,-1.2,-3.0);
    local_98._0_4_ = local_a0.m_data[0];
    local_98._4_4_ = local_a0.m_data[1];
    tcu::Vector<float,_2>::Vector(local_b4,1.2,2.5);
    iteration.p0.m_data[0] = local_b4[0].m_data[0];
    iteration.p0.m_data[1] = local_b4[0].m_data[1];
    fVar5 = std::numeric_limits<float>::infinity();
    tcu::Vector<float,_4>::Vector(&local_d4,fVar5);
    rr::GenericVec4::GenericVec4<float>(&local_c4,&local_d4);
    rr::GenericVec4::operator=((GenericVec4 *)&iteration.p1,&local_c4);
    tcu::Vector<float,_4>::Vector(&local_e4,0.5);
    iteration.borderColor.v._8_4_ = local_e4.m_data[0];
    iteration.borderColor.v._12_4_ = local_e4.m_data[1];
    iteration.lookupScale.m_data[0] = local_e4.m_data[2];
    iteration.lookupScale.m_data[1] = local_e4.m_data[3];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_1.compareRef,0.25);
    iteration.lookupScale.m_data[2] = iteration_1.compareRef;
    iteration.lookupScale.m_data[3] = fStack_f0;
    std::__cxx11::string::operator=((string *)&iteration.minFilter,"border value infinity");
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_98);
    TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_98);
    TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_170);
    tcu::Vector<float,_2>::Vector(&local_178,-0.25,-0.75);
    local_170._0_4_ = local_178.m_data[0];
    local_170._4_4_ = local_178.m_data[1];
    tcu::Vector<float,_2>::Vector(&local_180,2.25,1.25);
    iteration_1.p0.m_data[0] = local_180.m_data[0];
    iteration_1.p0.m_data[1] = local_180.m_data[1];
    fVar5 = std::numeric_limits<float>::infinity();
    tcu::Vector<float,_4>::Vector(&local_1a0,-fVar5);
    rr::GenericVec4::GenericVec4<float>(&local_190,&local_1a0);
    rr::GenericVec4::operator=((GenericVec4 *)&iteration_1.p1,&local_190);
    tcu::Vector<float,_4>::Vector(&local_1b0,0.5);
    iteration_1.borderColor.v._8_4_ = local_1b0.m_data[0];
    iteration_1.borderColor.v._12_4_ = local_1b0.m_data[1];
    iteration_1.lookupScale.m_data[0] = local_1b0.m_data[2];
    iteration_1.lookupScale.m_data[1] = local_1b0.m_data[3];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(numBits.m_data + 2),0.25);
    iteration_1.lookupScale.m_data[2] = (float)numBits.m_data[2];
    iteration_1.lookupScale.m_data[3] = (float)numBits.m_data[3];
    std::__cxx11::string::operator=
              ((string *)&iteration_1.minFilter,"border value negative infinity");
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_170);
    TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_170);
  }
  else if (local_791 == false) {
    if (local_781 != false) {
      lookupBias.m_data[2]._3_1_ =
           (this->super_TextureBorderClampTest).m_channelClass ==
           TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
      if ((bool)lookupBias.m_data[2]._3_1_) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupScale.m_data + 2),0.5);
      }
      else {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupScale.m_data + 2),0.25);
      }
      if ((lookupBias.m_data[2]._3_1_ & 1) == 0) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_6.compareRef,0.5);
      }
      else {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_6.compareRef,0.25);
      }
      TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_698);
      tcu::Vector<float,_2>::Vector(&local_6a0,-1.2,-3.0);
      local_698._0_4_ = local_6a0.m_data[0];
      local_698._4_4_ = local_6a0.m_data[1];
      tcu::Vector<float,_2>::Vector(&local_6a8,1.2,2.5);
      iteration_6.p0.m_data[0] = local_6a8.m_data[0];
      iteration_6.p0.m_data[1] = local_6a8.m_data[1];
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&iteration_7.compareMode,1.1,1.3,2.2,1.3);
      local_6b8 = (anon_union_16_3_1194ccdc_for_v)
                  mapToFormatColorUnits(&stack0xffffffffffffffe8,(Vec4 *)&iteration_7.compareMode);
      rr::GenericVec4::operator=((GenericVec4 *)&iteration_6.p1,(GenericVec4 *)&local_6b8);
      iteration_6.borderColor.v._8_8_ = stack0xfffffffffffff9e4;
      iteration_6.lookupScale.m_data[0] = lookupScale.m_data[0];
      iteration_6.lookupScale.m_data[1] = lookupScale.m_data[1];
      iteration_6.lookupScale.m_data[2] = lookupScale.m_data[2];
      iteration_6.lookupScale.m_data[3] = lookupScale.m_data[3];
      iteration_6.lookupBias.m_data[0] = lookupBias.m_data[0];
      iteration_6.lookupBias.m_data[1] = lookupBias.m_data[1];
      std::__cxx11::string::operator=
                ((string *)&iteration_6.minFilter,"border values larger than maximum");
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(&this->m_iterations,(value_type *)local_698);
      TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_698);
      TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_740);
      tcu::Vector<float,_2>::Vector(&local_748,-0.25,-0.75);
      local_740._0_4_ = local_748.m_data[0];
      local_740._4_4_ = local_748.m_data[1];
      tcu::Vector<float,_2>::Vector(&local_750,2.25,1.25);
      iteration_7.p0.m_data[0] = local_750.m_data[0];
      iteration_7.p0.m_data[1] = local_750.m_data[1];
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&stack0xfffffffffffff890,-0.2,-0.9,-2.4,-0.6);
      local_760 = (anon_union_16_3_1194ccdc_for_v)
                  mapToFormatColorUnits(&stack0xffffffffffffffe8,(Vec4 *)&stack0xfffffffffffff890);
      rr::GenericVec4::operator=((GenericVec4 *)&iteration_7.p1,(GenericVec4 *)&local_760);
      iteration_7.borderColor.v._8_8_ = stack0xfffffffffffff9e4;
      iteration_7.lookupScale.m_data[0] = lookupScale.m_data[0];
      iteration_7.lookupScale.m_data[1] = lookupScale.m_data[1];
      iteration_7.lookupScale.m_data[2] = lookupScale.m_data[2];
      iteration_7.lookupScale.m_data[3] = lookupScale.m_data[3];
      iteration_7.lookupBias.m_data[0] = lookupBias.m_data[0];
      iteration_7.lookupBias.m_data[1] = lookupBias.m_data[1];
      std::__cxx11::string::operator=
                ((string *)&iteration_7.minFilter,"border values less than minimum");
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(&this->m_iterations,(value_type *)local_740);
      TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_740);
    }
  }
  else {
    tcu::getTextureFormatBitDepth((tcu *)&ndx,&stack0xffffffffffffffe8);
    isSigned_00 = (this->super_TextureBorderClampTest).m_channelClass ==
                  TEXTURECHANNELCLASS_SIGNED_INTEGER;
    for (minValue.m_data[2] = 0; minValue.m_data[2] < 4; minValue.m_data[2] = minValue.m_data[2] + 1
        ) {
    }
    getNBitIntegerVec4MinValue((anon_unknown_1 *)(maxValue.m_data + 2),isSigned_00,(IVec4 *)&ndx);
    getNBitIntegerVec4MaxValue((anon_unknown_1 *)(valueRange.m_data + 2),isSigned_00,(IVec4 *)&ndx);
    tcu::operator-((tcu *)(divSafeRange.m_data + 2),(Vector<int,_4> *)(valueRange.m_data + 2),
                   (Vector<int,_4> *)(maxValue.m_data + 2));
    piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),0);
    if (*piVar2 == 0) {
      local_798 = 1;
    }
    else {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),0);
      local_798 = *piVar2;
    }
    piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),1);
    if (*piVar2 == 0) {
      local_7a0 = 1;
    }
    else {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),1);
      local_7a0 = *piVar2;
    }
    piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),2);
    if (*piVar2 == 0) {
      local_7a8 = 1;
    }
    else {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),2);
      local_7a8 = *piVar2;
    }
    piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),3);
    if (*piVar2 == 0) {
      local_7b0 = 1;
    }
    else {
      piVar2 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)(divSafeRange.m_data + 2),3);
      local_7b0 = *piVar2;
    }
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)(value.m_data + 2),local_798,local_7a0,local_7a8,local_7b0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration_2.compareMode,1);
    tcu::operator+((tcu *)local_228,(Vector<int,_4> *)(valueRange.m_data + 2),
                   (Vector<int,_4> *)&iteration_2.compareMode);
    TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_2b0);
    tcu::Vector<float,_2>::Vector(&local_2b8,-1.2,-3.0);
    local_2b0._0_4_ = local_2b8.m_data[0];
    local_2b0._4_4_ = local_2b8.m_data[1];
    tcu::Vector<float,_2>::Vector(&local_2c0,1.2,2.5);
    iteration_2.p0.m_data[0] = local_2c0.m_data[0];
    iteration_2.p0.m_data[1] = local_2c0.m_data[1];
    if (isSigned_00) {
      rr::GenericVec4::GenericVec4<int>(&local_2d0,(Vector<int,_4> *)local_228);
    }
    else {
      tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_2e0);
      rr::GenericVec4::GenericVec4<unsigned_int>(&local_2d0,&local_2e0);
    }
    rr::GenericVec4::operator=((GenericVec4 *)&iteration_2.p1,&local_2d0);
    tcu::Vector<float,_4>::Vector(&local_300,0.5);
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_310);
    tcu::operator/((tcu *)&local_2f0,&local_300,&local_310);
    iteration_2.borderColor.v._8_8_ = local_2f0;
    iteration_2.lookupScale.m_data[0] = local_2e8[0];
    iteration_2.lookupScale.m_data[1] = local_2e8[1];
    if (isSigned_00) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(value_1.m_data + 2),0.5);
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(value_1.m_data + 2),0.25);
    }
    iteration_2.lookupScale.m_data[2] = (float)value_1.m_data[2];
    iteration_2.lookupScale.m_data[3] = (float)value_1.m_data[3];
    std::__cxx11::string::operator=
              ((string *)&iteration_2.minFilter,"border values one larger than maximum");
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_2b0);
    TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_2b0);
    if (isSigned_00) {
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration_3.compareMode,1);
      tcu::operator-((tcu *)local_330,(Vector<int,_4> *)(maxValue.m_data + 2),
                     (Vector<int,_4> *)&iteration_3.compareMode);
      TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_3b8);
      tcu::Vector<float,_2>::Vector(&local_3c0,-0.25,-0.75);
      local_3b8._0_4_ = local_3c0.m_data[0];
      local_3b8._4_4_ = local_3c0.m_data[1];
      tcu::Vector<float,_2>::Vector(&local_3c8,2.25,1.25);
      iteration_3.p0.m_data[0] = local_3c8.m_data[0];
      iteration_3.p0.m_data[1] = local_3c8.m_data[1];
      rr::GenericVec4::GenericVec4<int>(&local_3d8,(Vector<int,_4> *)local_330);
      rr::GenericVec4::operator=((GenericVec4 *)&iteration_3.p1,&local_3d8);
      tcu::Vector<float,_4>::Vector(&local_3f8,0.5);
      tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_408);
      tcu::operator/((tcu *)&local_3e8,&local_3f8,&local_408);
      iteration_3.borderColor.v._8_8_ = local_3e8;
      iteration_3.lookupScale.m_data[0] = afStack_3e0[0];
      iteration_3.lookupScale.m_data[1] = afStack_3e0[1];
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(value_2.m_data + 2),0.5);
      iteration_3.lookupScale.m_data[2] = (float)value_2.m_data[2];
      iteration_3.lookupScale.m_data[3] = (float)value_2.m_data[3];
      std::__cxx11::string::operator=
                ((string *)&iteration_3.minFilter,"border values one less than minimum");
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(&this->m_iterations,(value_type *)local_3b8);
      TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_3b8);
      iVar1 = std::numeric_limits<int>::max();
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration_4.compareMode,iVar1);
    }
    else {
      s = std::numeric_limits<unsigned_int>::max();
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration_4.compareMode,s);
    }
    TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_4a0);
    tcu::Vector<float,_2>::Vector(&local_4a8,-1.6,-2.1);
    local_4a0._0_4_ = local_4a8.m_data[0];
    local_4a0._4_4_ = local_4a8.m_data[1];
    tcu::Vector<float,_2>::Vector(&local_4b0,1.2,3.5);
    iteration_4.p0.m_data[0] = local_4b0.m_data[0];
    iteration_4.p0.m_data[1] = local_4b0.m_data[1];
    if (isSigned_00) {
      rr::GenericVec4::GenericVec4<int>(&local_4c0,(Vector<int,_4> *)&iteration_4.compareMode);
    }
    else {
      tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_4d0);
      rr::GenericVec4::GenericVec4<unsigned_int>(&local_4c0,&local_4d0);
    }
    rr::GenericVec4::operator=((GenericVec4 *)&iteration_4.p1,&local_4c0);
    tcu::Vector<float,_4>::Vector(&local_4f0,0.5);
    tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_500);
    tcu::operator/((tcu *)&local_4e0,&local_4f0,&local_500);
    iteration_4.borderColor.v._8_8_ = local_4e0;
    iteration_4.lookupScale.m_data[0] = afStack_4d8[0];
    iteration_4.lookupScale.m_data[1] = afStack_4d8[1];
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(value_3.m_data + 2),0.25);
    iteration_4.lookupScale.m_data[2] = (float)value_3.m_data[2];
    iteration_4.lookupScale.m_data[3] = (float)value_3.m_data[3];
    std::__cxx11::string::operator=((string *)&iteration_4.minFilter,"border values 32-bit maximum")
    ;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
    ::push_back(&this->m_iterations,(value_type *)local_4a0);
    TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_4a0);
    if (isSigned_00) {
      iVar1 = std::numeric_limits<int>::min();
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&iteration_5.compareMode,iVar1);
      TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_598);
      tcu::Vector<float,_2>::Vector(&local_5a0,-2.6,-4.0);
      local_598._0_4_ = local_5a0.m_data[0];
      local_598._4_4_ = local_5a0.m_data[1];
      tcu::Vector<float,_2>::Vector(&local_5a8,1.1,1.5);
      iteration_5.p0.m_data[0] = local_5a8.m_data[0];
      iteration_5.p0.m_data[1] = local_5a8.m_data[1];
      rr::GenericVec4::GenericVec4<int>(&local_5b8,(Vector<int,_4> *)&iteration_5.compareMode);
      rr::GenericVec4::operator=((GenericVec4 *)&iteration_5.p1,&local_5b8);
      tcu::Vector<float,_4>::Vector(&local_5d8,0.5);
      tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_5e8);
      tcu::operator/((tcu *)&local_5c8,&local_5d8,&local_5e8);
      iteration_5.borderColor.v._8_8_ = local_5c8;
      iteration_5.lookupScale.m_data[0] = afStack_5c0[0];
      iteration_5.lookupScale.m_data[1] = afStack_5c0[1];
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(lookupBias.m_data + 3),0.25);
      iteration_5.lookupScale.m_data[2] = lookupBias.m_data[3];
      iteration_5.lookupScale.m_data[3] = fStack_5f4;
      std::__cxx11::string::operator=((string *)&iteration_5.minFilter,"border values 0");
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
      ::push_back(&this->m_iterations,(value_type *)local_598);
      TextureBorderClampTest::IterationConfig::~IterationConfig((IterationConfig *)local_598);
    }
  }
  iteration_8._4_4_ = 0;
  while( true ) {
    sVar3 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
            ::size(&this->m_iterations);
    if ((int)sVar3 <= iteration_8._4_4_) break;
    pvVar4 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
             ::operator[](&this->m_iterations,(long)iteration_8._4_4_);
    pvVar4->minFilter = this->m_filter;
    pvVar4->magFilter = this->m_filter;
    pvVar4->sWrapMode = 0x812d;
    pvVar4->tWrapMode = 0x812d;
    pvVar4->compareMode = 0;
    pvVar4->compareRef = 0.0;
    iteration_8._4_4_ = iteration_8._4_4_ + 1;
  }
  return iteration_8._4_4_;
}

Assistant:

void TextureBorderClampRangeClampCase::init (void)
{
	TextureBorderClampTest::init();

	const tcu::TextureFormat	texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const bool					isDepth			= isDepthFormat(m_texFormat, m_sampleMode);
	const bool					isFloat			= m_channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool					isFixed			= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const bool					isPureInteger	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || m_channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER;

	if (isDepth || isFloat)
	{
		// infinities are commonly used values on depth/float borders
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value infinity";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity()));
			iteration.lookupScale	= tcu::Vec4(0.5f);
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border value negative infinity";
			m_iterations.push_back(iteration);
		}
	}
	else if (isPureInteger)
	{
		const tcu::IVec4			numBits		= tcu::getTextureFormatBitDepth(texFormat);
		const bool					isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER;

		// can't overflow 32bit integers with 32bit integers
		for (int ndx = 0; ndx < 4; ++ndx)
			DE_ASSERT(numBits[ndx] == 0 || numBits[ndx] == 8 || numBits[ndx] == 16);

		const tcu::IVec4	minValue		= getNBitIntegerVec4MinValue(isSigned, numBits);
		const tcu::IVec4	maxValue		= getNBitIntegerVec4MaxValue(isSigned, numBits);
		const tcu::IVec4	valueRange		= maxValue - minValue;
		const tcu::IVec4	divSafeRange	((valueRange[0]==0) ? (1) : (valueRange[0]),
											 (valueRange[1]==0) ? (1) : (valueRange[1]),
											 (valueRange[2]==0) ? (1) : (valueRange[2]),
											 (valueRange[3]==0) ? (1) : (valueRange[3]));

		// format max
		{
			const tcu::IVec4 value = maxValue + tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= (isSigned) ? (tcu::Vec4(0.5f)) : (tcu::Vec4(0.25f));
			iteration.description	= "border values one larger than maximum";
			m_iterations.push_back(iteration);
		}
		// format min
		if (isSigned)
		{
			const tcu::IVec4 value = minValue - tcu::IVec4(1);

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.5f);
			iteration.description	= "border values one less than minimum";
			m_iterations.push_back(iteration);
		}
		// (u)int32 max
		{
			const tcu::IVec4 value = (isSigned) ? (tcu::IVec4(std::numeric_limits<deInt32>::max())) : (tcu::IVec4(std::numeric_limits<deUint32>::max()));

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.6f, -2.1f);
			iteration.p1			= tcu::Vec2( 1.2f,  3.5f);
			iteration.borderColor	= (isSigned) ? (rr::GenericVec4(value)) : (rr::GenericVec4(value.cast<deUint32>()));
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 32-bit maximum";
			m_iterations.push_back(iteration);
		}
		// int32 min
		if (isSigned)
		{
			const tcu::IVec4 value = tcu::IVec4(std::numeric_limits<deInt32>::min());

			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-2.6f, -4.0f);
			iteration.p1			= tcu::Vec2( 1.1f,  1.5f);
			iteration.borderColor	= rr::GenericVec4(value);
			iteration.lookupScale	= tcu::Vec4(0.5f) / divSafeRange.cast<float>();
			iteration.lookupBias	= tcu::Vec4(0.25f);
			iteration.description	= "border values 0";
			m_iterations.push_back(iteration);
		}
	}
	else if (isFixed)
	{
		const bool		isSigned	= m_channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;;
		const tcu::Vec4	lookupBias	= (isSigned) ? (tcu::Vec4(0.5f))    : (tcu::Vec4(0.25f)); // scale & bias to [0.25, 0.5] range to make out-of-range values visible
		const tcu::Vec4	lookupScale	= (isSigned) ? (tcu::Vec4(0.25f))   : (tcu::Vec4(0.5f));

		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-1.2f, -3.0f);
			iteration.p1			= tcu::Vec2( 1.2f,  2.5f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(1.1f, 1.3f, 2.2f, 1.3f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values larger than maximum";
			m_iterations.push_back(iteration);
		}
		{
			IterationConfig iteration;
			iteration.p0			= tcu::Vec2(-0.25f, -0.75f);
			iteration.p1			= tcu::Vec2( 2.25f,  1.25f);
			iteration.borderColor	= mapToFormatColorUnits(texFormat, tcu::Vec4(-0.2f, -0.9f, -2.4f, -0.6f));
			iteration.lookupScale	= lookupScale;
			iteration.lookupBias	= lookupBias;
			iteration.description	= "border values less than minimum";
			m_iterations.push_back(iteration);
		}
	}
	else
		DE_ASSERT(false);

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}